

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_data.c
# Opt level: O3

int iterdata(long totaln,long offset,long firstn,long nrows,int narray,iteratorCol *iter_col,
            void *usrdata)

{
  double dVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  undefined8 *puVar10;
  char *pcVar11;
  iteratorCol *piVar12;
  char *pcVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  
  if (firstn == 1) {
    iterdata::usrpt = (UserIter *)usrdata;
    iterdata::nnum = *usrdata;
    iterdata::ncmp = *(int *)((long)usrdata + 4);
    iterdata::ntxt = *(int *)((long)usrdata + 0x38);
    iterdata::nfloat = *(int *)((long)usrdata + 8);
    iterdata::flag_minmax = (int *)calloc((long)(iterdata::ncmp + iterdata::nnum),4);
    iterdata::repeat = (long *)calloc((long)narray,8);
    iterdata::datatype = (int *)calloc((long)narray,4);
    if (0 < narray) {
      uVar17 = 0;
      piVar12 = iter_col;
      do {
        lVar6 = fits_iter_get_repeat(piVar12);
        iterdata::repeat[uVar17] = lVar6;
        iVar4 = fits_iter_get_datatype(piVar12);
        iterdata::datatype[uVar17] = iVar4;
        uVar17 = uVar17 + 1;
        piVar12 = piVar12 + 1;
      } while ((uint)narray != uVar17);
    }
    iterdata_find_badspace = 0;
    iterdata_find_badlog = '\0';
  }
  uVar5 = iterdata::ncmp + iterdata::nnum;
  uVar17 = (ulong)uVar5;
  if (uVar5 != 0 && SCARRY4(iterdata::ncmp,iterdata::nnum) == (int)uVar5 < 0) {
    lVar6 = 0;
    if (0 < nrows) {
      lVar6 = nrows;
    }
    lVar14 = 0;
    do {
      lVar7 = fits_iter_get_array(iter_col + lVar14);
      lVar19 = iterdata::repeat[lVar14];
      if ((nrows << (iterdata::nnum <= lVar14) != 0 && lVar19 != 0) &&
         (iterdata::usrpt->indatatyp[lVar14] == 1)) {
        pdVar15 = (double *)(lVar7 + lVar19 * 8);
        lVar16 = 1;
        lVar18 = -8;
        do {
          if (lVar6 + lVar16 == 1) goto LAB_001058b8;
          dVar1 = *pdVar15;
          lVar16 = lVar16 + -1;
          pdVar15 = pdVar15 + lVar19;
          lVar18 = lVar18 + 8;
        } while ((iterdata::usrpt->mask[lVar14] & (byte)(int)dVar1) == 0);
        uVar5 = fits_iter_get_colnum(iter_col + lVar14);
        sprintf(errmes,"Row #%ld, and Column #%d: X vector ",firstn - lVar16,(ulong)uVar5);
        lVar19 = iterdata::repeat[lVar14];
        if (0 < lVar19) {
          lVar16 = 0;
          do {
            sprintf(comm,"0x%02x ",
                    (ulong)((int)*(double *)(lVar19 * lVar18 + lVar7 + 8 + lVar16 * 8) & 0xff));
            strcat(errmes,comm);
            lVar19 = iterdata::repeat[lVar14];
            lVar16 = lVar16 + 1;
          } while (lVar16 < lVar19);
        }
        sVar8 = strlen(errmes);
        builtin_strncpy(errmes + sVar8 + 0xf,"tified.",8);
        builtin_strncpy(errmes + sVar8,"is not l",8);
        builtin_strncpy(errmes + sVar8 + 8,"eft just",8);
        wrterr(iterdata::usrpt->out,errmes,2);
        builtin_strncpy(errmes,"             (Other rows may have errors).",0x2b);
        print_fmt(iterdata::usrpt->out,errmes,0xd);
      }
LAB_001058b8:
      lVar14 = lVar14 + 1;
      uVar17 = (long)iterdata::nnum + (long)iterdata::ncmp;
    } while (lVar14 < (long)uVar17);
  }
  if (iterdata::ntxt < 1) {
    uVar17 = (ulong)(uint)((int)uVar17 + iterdata::ntxt);
  }
  else {
    lVar6 = (long)(int)uVar17;
    do {
      if (iterdata::datatype[lVar6] == 0x10) {
        if (nrows != 0) {
          lVar14 = fits_iter_get_array(iter_col + lVar6);
          if (0 < nrows) {
            lVar19 = 0;
            do {
              pcVar9 = *(char **)(lVar14 + 8 + lVar19 * 8);
              cVar2 = *pcVar9;
              while (cVar2 != '\0') {
                pcVar9 = pcVar9 + 1;
                if ((byte)(cVar2 + 0x81U) < 0xa1) {
                  uVar5 = fits_iter_get_colnum(iter_col + lVar6);
                  sprintf(errmes,"String in row #%ld, column #%d contains non-ASCII text.",
                          lVar19 + firstn,(ulong)uVar5);
                  wrterr(iterdata::usrpt->out,errmes,1);
                  builtin_strncpy(errmes,"             (Other rows may have errors).",0x2b);
                  print_fmt(iterdata::usrpt->out,errmes,0xd);
                  break;
                }
                cVar2 = *pcVar9;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 != nrows);
          }
        }
      }
      else if (nrows != 0 && iterdata::repeat[lVar6] != 0) {
        lVar14 = fits_iter_get_array(iter_col + lVar6);
        if (iterdata_find_badlog == '\0') {
          lVar19 = iterdata::repeat[lVar6];
          if (0 < lVar19 * nrows) {
            lVar7 = 0;
            do {
              if (2 < *(byte *)(lVar14 + 1 + lVar7)) {
                lVar7 = lVar7 + firstn + -1;
                uVar5 = fits_iter_get_colnum(iter_col + lVar6,lVar19,lVar7 % lVar19);
                sprintf(errmes,
                        "Logical value in row #%ld, column #%d not equal to \'T\', \'F\', or 0",
                        lVar7 / lVar19 + 1,(ulong)uVar5);
                wrterr(iterdata::usrpt->out,errmes,1);
                builtin_strncpy(errmes,"             (Other rows may have similar errors).",0x33);
                print_fmt(iterdata::usrpt->out,errmes,0xd);
                iterdata_find_badlog = '\x01';
                break;
              }
              lVar7 = lVar7 + 1;
            } while (lVar19 * nrows - lVar7 != 0);
          }
        }
      }
      lVar6 = lVar6 + 1;
      uVar17 = (long)iterdata::ntxt + (long)iterdata::ncmp + (long)iterdata::nnum;
    } while (lVar6 < (long)uVar17);
  }
  if (0 < iterdata::nfloat) {
    lVar6 = (long)(int)uVar17;
    do {
      if (nrows != 0) {
        puVar10 = (undefined8 *)fits_iter_get_array();
        iterdata_find_badspace = 0;
        if (0 < nrows) {
          pcVar9 = (char *)*puVar10;
          lVar14 = 0;
          do {
            pcVar13 = (char *)puVar10[lVar14 + 1];
            iVar4 = strcmp(pcVar9,pcVar13);
            if ((iVar4 != 0) && (pcVar11 = strchr(pcVar13,0x2e), pcVar11 == (char *)0x0)) {
              for (; *pcVar13 == ' '; pcVar13 = pcVar13 + 1) {
              }
              if (*pcVar13 != '\0') {
                uVar5 = fits_iter_get_colnum(iter_col + lVar6);
                sprintf(errmes,"Number in row #%ld, column #%d has no decimal point:",
                        lVar14 + firstn,(ulong)uVar5);
                wrterr(iterdata::usrpt->out,errmes,1);
                strcpy(errmes,pcVar13);
                sVar8 = strlen(errmes);
                builtin_strncpy(errmes + sVar8 + 0x20,"rrors).",8);
                builtin_strncpy(errmes + sVar8,"  (Other",8);
                builtin_strncpy(errmes + sVar8 + 8," rows ma",8);
                builtin_strncpy(errmes + sVar8 + 0x10,"y have s",8);
                builtin_strncpy(errmes + sVar8 + 0x18,"imilar e",8);
                print_fmt(iterdata::usrpt->out,errmes,0xd);
                bVar3 = iterdata_find_badspace;
                goto LAB_00105c61;
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != nrows);
          bVar3 = 0;
LAB_00105c61:
          if (0 < nrows && (bVar3 & 1) == 0) {
            lVar14 = 0;
            do {
              pcVar9 = (char *)puVar10[lVar14 + 1];
              iVar4 = strcmp((char *)*puVar10,pcVar9);
              if (iVar4 != 0) {
                do {
                  pcVar13 = pcVar9;
                  pcVar9 = pcVar13 + 1;
                } while (*pcVar13 == ' ');
                sVar8 = strlen(pcVar13);
                if (sVar8 != 1 && -1 < (long)(sVar8 - 1)) {
                  do {
                    if (pcVar13[sVar8 - 1] != ' ') break;
                    pcVar13[sVar8 - 1] = '\0';
                    sVar8 = sVar8 - 1;
                  } while (1 < (long)sVar8);
                }
                pcVar9 = strchr(pcVar13,0x20);
                if (pcVar9 != (char *)0x0) {
                  uVar5 = fits_iter_get_colnum(iter_col + lVar6);
                  sprintf(errmes,"Number in row #%ld, column #%d has embedded space:",
                          lVar14 + firstn,(ulong)uVar5);
                  wrterr(iterdata::usrpt->out,errmes,1);
                  strcpy(errmes,pcVar13);
                  sVar8 = strlen(errmes);
                  builtin_strncpy(errmes + sVar8 + 0x20,"rrors).",8);
                  builtin_strncpy(errmes + sVar8,"  (Other",8);
                  builtin_strncpy(errmes + sVar8 + 8," rows ma",8);
                  builtin_strncpy(errmes + sVar8 + 0x10,"y have s",8);
                  builtin_strncpy(errmes + sVar8 + 0x18,"imilar e",8);
                  print_fmt(iterdata::usrpt->out,errmes,0xd);
                  iterdata_find_badspace = 1;
                  break;
                }
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != nrows);
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (long)iterdata::nfloat + (long)iterdata::ntxt +
                     (long)iterdata::ncmp + (long)iterdata::nnum);
  }
  if (firstn + nrows + -1 == totaln) {
    free(iterdata::flag_minmax);
    free(iterdata::datatype);
    free(iterdata::repeat);
  }
  return 0;
}

Assistant:

int iterdata(long totaln, 
		 long offset, 
		 long firstn,
		 long nrows,
		 int narray,
		 iteratorCol *iter_col,
		 void *usrdata
		 )
{ 
    static UserIter *usrpt;
/*
    static FitsHdu  *hdupt;
*/
    static int nnum;
    static int ntxt;
    static int ncmp;
    static int nfloat;
    static int *flag_minmax = 0;			/* define the initial min and max value */
    static long *repeat;
    static int *datatype;
    static int find_badbit = 0; 
    static int find_baddot = 0; 
    static int find_badspace = 0; 
    static int find_badchar = 0; 
    static int find_badlog = 0; 

    double  *data;
    unsigned char *ldata;
    char **cdata;
    unsigned char *ucdata;
    char *floatvalue;

    /* bit column working space */
    static unsigned char bdata;

    int i; 
    long j,k,l;
    long nelem;

    if(firstn == 1 ) {  /* first time for this table, so initialize */
        usrpt = (UserIter *)usrdata;
/*
	hdupt= usrpt->hduptr;
*/
        nnum = usrpt->nnum;
        ncmp = usrpt->ncmp;
        ntxt = usrpt->ntxt;
        nfloat = usrpt->nfloat;
	flag_minmax = (int *)calloc(nnum+ncmp, sizeof(int));
	repeat   = (long *)calloc(narray,sizeof(long));
	datatype = (int *)calloc(narray,sizeof(int));
        for (i=0; i < narray; i++) {  
	    repeat[i] = fits_iter_get_repeat(&(iter_col[i]));
	    datatype[i] = fits_iter_get_datatype(&(iter_col[i])); 
        }
        find_badbit = 0; 
        find_baddot = 0; 
        find_badspace = 0; 
        find_badchar = 0; 
        find_badlog = 0; 
    }

    /* columns from  1 to nnum are scalar numerical columns. 
       columns from  nnum+1 to  nnum+ncmp are complex columns. (not used any more)
       columns from  nnum+ncmp are text columns */

    /* deal with the numerical column */
    for (i=0; i < nnum+ncmp; i++) { 
	data = (double *) fits_iter_get_array(&(iter_col[i]));
	j = 1;
	nelem = nrows * repeat[i];
	if(i >= nnum) nelem = 2 * nrows *repeat[i];
	if(nelem == 0) continue;
        find_badbit = 0;

        /* check for the bit jurisfication  */
        if(!find_badbit && usrpt->indatatyp[i] == TBIT ) { 
            for (k = 0; k < nrows; k++) {
               j = (k+1)*repeat[i];
               bdata = (unsigned char)data[j]; 
               if( bdata & usrpt->mask[i] ) { 
                  sprintf(errmes, 
                    "Row #%ld, and Column #%d: X vector ", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                  for (l = 1; l<= repeat[i]; l++) {
                     sprintf(comm, "0x%02x ", (unsigned char) data[k*repeat[i]+l]);
                     strcat(errmes,comm); 
                  }
                  strcat(errmes,"is not left justified."); 
                  wrterr(usrpt->out,errmes,2);
                  strcpy(errmes,
          "             (Other rows may have errors).");
                  print_fmt(usrpt->out,errmes,13);
                  find_badbit = 1;
                  break;
               }
            }
        }  
    }

    /* deal with character and logical columns */
    for (i = nnum + ncmp; i < nnum + ncmp + ntxt; i++) { 
        if(datatype[i] == TSTRING ) {	/* character */
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_badchar = 0;

            /* test for illegal ASCII text characters > 126  or < 32 */
            if (!find_badchar) {
              for (k = 0; k < nrows; k++) {
                ucdata = (unsigned char *)cdata[k+1];
                j = 0;
                while (ucdata[j] != 0) {

                  if ((ucdata[j] > 126) || (ucdata[j] < 32)) {
                    sprintf(errmes, 
                    "String in row #%ld, column #%d contains non-ASCII text.", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                      wrterr(usrpt->out,errmes,1);
                      strcpy(errmes,
          "             (Other rows may have errors).");
                      print_fmt(usrpt->out,errmes,13);
                    find_badchar = 1;
                    break;
                  }
                  j++;
                }
              }
            }
        }

	else {  			/* logical value */
            nelem = nrows * repeat[i];
	    if(nelem == 0) continue;
	    ldata = (unsigned char *) fits_iter_get_array(&(iter_col[i]));

            /* test for illegal logical column values */
            /* The first element in the array gives the value that is used to represent nulls */
            if (!find_badlog) {
                for(j = 1; j <= nrows * repeat[i]; j++) {
                  if (ldata[j] > 2) {
                    sprintf(errmes, 
                    "Logical value in row #%ld, column #%d not equal to 'T', 'F', or 0", 
                       (firstn+j - 2)/repeat[i] +1, 
                       fits_iter_get_colnum(&(iter_col[i]))); 
                       wrterr(usrpt->out,errmes,1);
                       strcpy(errmes,
         "             (Other rows may have similar errors).");
                       print_fmt(usrpt->out,errmes,13);
                       find_badlog = 1;
                       break; 
                  }
                }
            }
        }
    }

    for (i = nnum + ncmp +ntxt; i < nnum + ncmp + ntxt + nfloat; i++) { 
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_baddot = 0;
	    find_badspace = 0;

            /* test for missing (implicit) decimal point in floating point numbers */
            if (!find_baddot) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];
                if (strcmp(cdata[0], floatvalue) && !strchr(floatvalue, '.') ) {

		  while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                  if (strlen(floatvalue)) {  /* ignore completely blank fields */
		  
                    sprintf(errmes, 
                     "Number in row #%ld, column #%d has no decimal point:", firstn+k, 
                     fits_iter_get_colnum(&(iter_col[i]))); 
                     wrterr(usrpt->out,errmes,1);
                     strcpy(errmes, floatvalue);
                     strcat(errmes,
                  "  (Other rows may have similar errors).");
                     print_fmt(usrpt->out,errmes,13);
                     find_baddot = 1;
                     break;
                  }
                }
              }
            }

            if (!find_badspace) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];

                if (strcmp(cdata[0], floatvalue) ) {  /* not a null value? */
		    while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                    l = strlen(floatvalue) - 1;
		    while (l > 0 &&  floatvalue[l] == ' ') { /* remove trailing spaces */
		        floatvalue[l] = '\0';
			l--;
		    }

                    if (strchr(floatvalue, ' ') ) {
                      sprintf(errmes, 
                       "Number in row #%ld, column #%d has embedded space:", firstn+k, 
                         fits_iter_get_colnum(&(iter_col[i]))); 
                         wrterr(usrpt->out,errmes,1);
                         strcpy(errmes, floatvalue);
                         strcat(errmes,
                      "  (Other rows may have similar errors).");
                         print_fmt(usrpt->out,errmes,13);
                         find_badspace = 1;
                         break;
                    }
		}
            }
          }
    }

    if(firstn + nrows - 1 == totaln) { 
	free(flag_minmax);
	free(datatype);
	free(repeat); 
    }
    return 0; 
}